

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_scriptsig_p2pkh_from_der
              (uchar *pub_key,size_t pub_key_len,uchar *sig,size_t sig_len,uchar *bytes_out,
              size_t len,size_t *written)

{
  size_t len_00;
  int iVar1;
  int iVar2;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if (((pub_key != (uchar *)0x0) &&
      (((bytes_out != (uchar *)0x0 && sig_len - 1 < 0x49) &&
       (sig != (uchar *)0x0 && (pub_key_len - 0x21 & 0xffffffffffffffdf) == 0)) &&
       written != (size_t *)0x0)) && (sig_len + pub_key_len + 2 <= len)) {
    iVar1 = wally_script_push_from_bytes(sig,sig_len,0,bytes_out,len,written);
    if (iVar1 == 0) {
      len_00 = *written;
      iVar1 = 0;
      iVar2 = wally_script_push_from_bytes
                        (pub_key,pub_key_len,0,bytes_out + len_00,len - len_00,written);
      if (iVar2 == 0) {
        *written = *written + len_00;
      }
      else {
        wally_clear(bytes_out,len_00);
        iVar1 = iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_scriptsig_p2pkh_from_der(
    const unsigned char *pub_key, size_t pub_key_len,
    const unsigned char *sig, size_t sig_len,
    unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t n;
    int ret;

    if (written)
        *written = 0;

    if (!pub_key || !is_pk_len(pub_key_len) ||
        !sig || !sig_len || sig_len > EC_SIGNATURE_DER_MAX_LEN + 1 ||
        !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_get_push_size(pub_key_len) + script_get_push_size(sig_len))
        return WALLY_EINVAL;

    ret = wally_script_push_from_bytes(sig, sig_len, 0,
                                       bytes_out, len, written);
    if (ret == WALLY_OK) {
        n = *written;
        ret = wally_script_push_from_bytes(pub_key, pub_key_len, 0,
                                           bytes_out + n, len - n, written);
        if (ret == WALLY_OK) {
            *written += n;
        } else
            wally_clear(bytes_out, n);
    }
    return ret;
}